

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProblemFireFighting.cpp
# Opt level: O1

void __thiscall
ProblemFireFighting::ProblemFireFighting
          (ProblemFireFighting *this,size_t nrAgents,size_t nrHouses,size_t nrFLs,double costOfMove,
          bool forcePositionRepres)

{
  ostream *poVar1;
  MADPComponentDiscreteActions *this_00;
  MADPComponentDiscreteObservations *this_01;
  uint uVar2;
  pointer puVar3;
  pointer puVar4;
  vector<unsigned_long,std::allocator<unsigned_long>> *pvVar5;
  const_iterator it;
  size_t sVar6;
  StateDistribution *p;
  ulong uVar7;
  pointer puVar8;
  ulong uVar9;
  undefined7 in_register_00000081;
  uint uVar10;
  bool bVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  double dVar21;
  undefined1 extraout_var [56];
  undefined1 in_ZMM1 [64];
  undefined1 in_XMM4 [16];
  vector<unsigned_long,_std::allocator<unsigned_long>_> nrPos_vec;
  vector<unsigned_int,_std::allocator<unsigned_int>_> s_vec;
  vector<double,_std::allocator<double>_> isd;
  size_t nrPos;
  stringstream ss;
  string local_270;
  size_t local_250;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_248;
  vector<unsigned_long,std::allocator<unsigned_long>> *local_240;
  double local_238;
  string local_230;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_210;
  vector<double,_std::allocator<double>_> local_1f8;
  pointer_____offset_0x60___ *local_1e0;
  double local_1d8;
  double local_1d0;
  MADPComponentDiscreteStates *local_1c8;
  value_type_conflict2 local_1c0;
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [7];
  ios_base local_138 [264];
  
  auVar14 = in_ZMM1._0_16_;
  sVar6 = CONCAT71(in_register_00000081,forcePositionRepres);
  *(undefined8 *)&this->field_0x280 = 0x5b5710;
  *(undefined8 *)&this->field_0x288 = 0x5b5968;
  local_250 = nrFLs;
  SoftPrintBriefDescription_abi_cxx11_
            ((string *)local_1b8,(ProblemFireFighting *)nrAgents,nrHouses,nrFLs,sVar6);
  SoftPrintDescription_abi_cxx11_
            (&local_270,(ProblemFireFighting *)nrAgents,nrHouses,local_250,sVar6);
  SoftPrintBriefDescription_abi_cxx11_
            (&local_230,(ProblemFireFighting *)nrAgents,nrHouses,local_250,sVar6);
  local_1e0 = &PTR_construction_vtable_96__005b4458;
  DecPOMDPDiscrete::DecPOMDPDiscrete
            (&this->super_DecPOMDPDiscrete,&PTR_construction_vtable_96__005b4458,(string *)local_1b8
             ,&local_270,&local_230);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
    operator_delete((void *)local_1b8._0_8_,local_1a8[0]._M_allocated_capacity + 1);
  }
  *(undefined8 *)
   &(this->super_DecPOMDPDiscrete).super_MultiAgentDecisionProcessDiscrete.
    super_MultiAgentDecisionProcess = 0x5b3c80;
  *(undefined8 *)&this->field_0x280 = 0x5b4080;
  *(undefined8 *)&this->field_0x288 = 0x5b42d8;
  *(undefined8 *)&(this->super_DecPOMDPDiscrete).super_MultiAgentDecisionProcessDiscrete.field_0x200
       = 0x5b3ef8;
  *(size_t *)&(this->super_DecPOMDPDiscrete).field_0x220 = nrAgents;
  *(size_t *)&(this->super_DecPOMDPDiscrete).field_0x228 = nrHouses;
  this->_m_nrFireLevels = local_250;
  local_240 = (vector<unsigned_long,std::allocator<unsigned_long>> *)&this->_m_nrPerStateFeatureVec;
  (this->_m_nrPerStateFeatureVec).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_nrPerStateFeatureVec).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_m_nrPerStateFeatureVec).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_248 = &this->_m_nrFLs_vec;
  (this->_m_nrFLs_vec).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_nrFLs_vec).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_m_nrFLs_vec).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  MultiAgentDecisionProcessDiscrete::SetSparse((MultiAgentDecisionProcessDiscrete *)this,true);
  MultiAgentDecisionProcess::SetNrAgents((MultiAgentDecisionProcess *)this,nrAgents);
  auVar13 = vcvtusi2sd_avx512f(auVar14,local_250);
  auVar14 = vcvtusi2sd_avx512f(auVar14,nrHouses);
  local_238 = auVar14._0_8_;
  auVar16._0_8_ = pow(auVar13._0_8_,local_238);
  auVar16._8_56_ = extraout_var;
  sVar6 = vcvttsd2usi_avx512f(auVar16._0_16_);
  this->_m_nrJointFirelevels = sVar6;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1b8,nrHouses,&local_250,
             (allocator_type *)&local_270);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign(local_248,local_1b8);
  if ((pointer)local_1b8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_1b8._0_8_,local_1a8[0]._M_allocated_capacity - local_1b8._0_8_);
  }
  if (costOfMove <= 0.0 && !forcePositionRepres) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Not including positions",0x17);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
    std::ostream::put(-0x50);
    std::ostream::flush();
    this->_m_includePositions = false;
    this->_m_nrStateFeatures = nrHouses;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_240,local_248);
    uVar9 = this->_m_nrJointFirelevels;
    if (uVar9 != 0) {
      uVar10 = 1;
      do {
        IndexTools::JointToIndividualIndices
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_230,uVar10 - 1,
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_240);
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1b8 + 0x10),"S_",2);
        PrintTools::SoftPrintVector<unsigned_int>
                  (&local_270,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_230);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1b8 + 0x10),local_270._M_dataplus._M_p,
                   local_270._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_270._M_dataplus._M_p != &local_270.field_2) {
          operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::stringbuf::str();
        MADPComponentDiscreteStates::AddState
                  (&(this->super_DecPOMDPDiscrete).super_MultiAgentDecisionProcessDiscrete._m_S,
                   &local_270);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_270._M_dataplus._M_p != &local_270.field_2) {
          operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
        std::ios_base::~ios_base(local_138);
        if (local_230._M_dataplus._M_p != (pointer)0x0) {
          operator_delete(local_230._M_dataplus._M_p,
                          local_230.field_2._M_allocated_capacity - (long)local_230._M_dataplus._M_p
                         );
        }
        uVar7 = (ulong)uVar10;
        uVar10 = uVar10 + 1;
      } while (uVar7 < uVar9);
    }
    MADPComponentDiscreteStates::SetUniformISD
              (&(this->super_DecPOMDPDiscrete).super_MultiAgentDecisionProcessDiscrete._m_S);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Including position",0x12);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
    std::ostream::put(-0x50);
    std::ostream::flush();
    this->_m_includePositions = true;
    this->_m_nrStateFeatures = nrHouses + nrAgents;
    local_1c0 = nrHouses + 1;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1b8,nrHouses,
               &local_250,(allocator_type *)&local_270);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign(local_248,local_1b8);
    if ((pointer)local_1b8._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_1b8._0_8_,local_1a8[0]._M_allocated_capacity - local_1b8._0_8_);
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_230,nrAgents,
               &local_1c0,(allocator_type *)local_1b8);
    pvVar5 = local_240;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_240,local_248);
    std::vector<unsigned_long,std::allocator<unsigned_long>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
              (pvVar5,(this->_m_nrPerStateFeatureVec).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_finish,local_230._M_dataplus._M_p,
               local_230._M_string_length);
    puVar3 = (this->_m_nrPerStateFeatureVec).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar4 = (this->_m_nrPerStateFeatureVec).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    dVar12 = 4.94065645841247e-324;
    if (puVar3 < puVar4) {
      puVar8 = puVar3 + 1;
      if (puVar3 + 1 < puVar4) {
        puVar8 = puVar4;
      }
      auVar16 = vpbroadcastq_avx512f();
      auVar16 = vpsrlq_avx512f(auVar16,3);
      auVar17 = vpbroadcastq_avx512f(ZEXT816(1));
      uVar9 = 0;
      auVar18 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      do {
        auVar19 = vmovdqa64_avx512f(auVar17);
        auVar17 = vpbroadcastq_avx512f();
        auVar17 = vporq_avx512f(auVar17,auVar18);
        uVar7 = vpcmpuq_avx512f(auVar17,auVar16,2);
        auVar17 = vmovdqu64_avx512f(*(undefined1 (*) [64])(puVar3 + uVar9));
        auVar20._8_8_ = (ulong)((byte)(uVar7 >> 1) & 1) * auVar17._8_8_;
        auVar20._0_8_ = (ulong)((byte)uVar7 & 1) * auVar17._0_8_;
        auVar20._16_8_ = (ulong)((byte)(uVar7 >> 2) & 1) * auVar17._16_8_;
        auVar20._24_8_ = (ulong)((byte)(uVar7 >> 3) & 1) * auVar17._24_8_;
        auVar20._32_8_ = (ulong)((byte)(uVar7 >> 4) & 1) * auVar17._32_8_;
        auVar20._40_8_ = (ulong)((byte)(uVar7 >> 5) & 1) * auVar17._40_8_;
        auVar20._48_8_ = (ulong)((byte)(uVar7 >> 6) & 1) * auVar17._48_8_;
        auVar20._56_8_ = (uVar7 >> 7) * auVar17._56_8_;
        auVar17 = vpmullq_avx512dq(auVar20,auVar19);
        uVar9 = uVar9 + 8;
      } while (((~(ulong)puVar3 + (long)puVar8 >> 3) + 8 & 0xfffffffffffffff8) != uVar9);
      auVar16 = vmovdqa64_avx512f(auVar17);
      bVar11 = (bool)((byte)uVar7 & 1);
      auVar17._0_8_ = (ulong)bVar11 * auVar16._0_8_ | (ulong)!bVar11 * auVar19._0_8_;
      bVar11 = (bool)((byte)(uVar7 >> 1) & 1);
      auVar17._8_8_ = (ulong)bVar11 * auVar16._8_8_ | (ulong)!bVar11 * auVar19._8_8_;
      bVar11 = (bool)((byte)(uVar7 >> 2) & 1);
      auVar17._16_8_ = (ulong)bVar11 * auVar16._16_8_ | (ulong)!bVar11 * auVar19._16_8_;
      bVar11 = (bool)((byte)(uVar7 >> 3) & 1);
      auVar17._24_8_ = (ulong)bVar11 * auVar16._24_8_ | (ulong)!bVar11 * auVar19._24_8_;
      bVar11 = (bool)((byte)(uVar7 >> 4) & 1);
      auVar17._32_8_ = (ulong)bVar11 * auVar16._32_8_ | (ulong)!bVar11 * auVar19._32_8_;
      bVar11 = (bool)((byte)(uVar7 >> 5) & 1);
      auVar17._40_8_ = (ulong)bVar11 * auVar16._40_8_ | (ulong)!bVar11 * auVar19._40_8_;
      bVar11 = (bool)((byte)(uVar7 >> 6) & 1);
      auVar17._48_8_ = (ulong)bVar11 * auVar16._48_8_ | (ulong)!bVar11 * auVar19._48_8_;
      auVar17._56_8_ = (uVar7 >> 7) * auVar16._56_8_ | (ulong)!SUB81(uVar7 >> 7,0) * auVar19._56_8_;
      auVar15 = vextracti64x4_avx512f(auVar17,1);
      auVar16 = vpmullq_avx512dq(auVar17,ZEXT3264(auVar15));
      auVar13 = vpmullq_avx512vl(auVar16._0_16_,auVar16._16_16_);
      auVar14 = vpshufd_avx(auVar13,0xee);
      auVar14 = vpmullq_avx512vl(auVar13,auVar14);
      dVar12 = auVar14._0_8_;
    }
    local_1b8._0_8_ = (pointer)0x0;
    std::vector<double,_std::allocator<double>_>::vector
              (&local_1f8,(size_type)dVar12,(value_type_conflict3 *)local_1b8,
               (allocator_type *)&local_270);
    auVar14 = vcvtusi2sd_avx512f(in_XMM4,local_250);
    dVar21 = pow(auVar14._0_8_,local_238);
    if (dVar12 != 0.0) {
      local_1d8 = 1.0 / dVar21;
      poVar1 = (ostream *)(local_1b8 + 0x10);
      local_1c8 = &(this->super_DecPOMDPDiscrete).super_MultiAgentDecisionProcessDiscrete._m_S;
      dVar21 = 0.0;
      local_1d0 = dVar12;
      do {
        local_238 = dVar21;
        IndexTools::JointToIndividualIndices
                  (&local_210,SUB84(dVar21,0),
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_240);
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"S_",2);
        uVar9 = 0;
        if (nrHouses != 0) {
          do {
            std::__ostream_insert<char,std::char_traits<char>>(poVar1,"f",1);
            if ((ulong)((long)local_210.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)local_210.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 2) <= uVar9) {
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                         ,uVar9);
            }
            std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
            uVar9 = (ulong)((int)uVar9 + 1);
          } while (uVar9 < nrHouses);
        }
        bVar11 = true;
        if (uVar9 < this->_m_nrStateFeatures) {
          uVar10 = (uint)uVar9;
          bVar11 = true;
          do {
            uVar10 = uVar10 + 1;
            if ((ulong)((long)local_210.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)local_210.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 2) <= uVar9) {
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                        );
            }
            uVar2 = local_210.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar9];
            std::__ostream_insert<char,std::char_traits<char>>(poVar1,"h",1);
            if (uVar2 == nrHouses) {
              std::__ostream_insert<char,std::char_traits<char>>(poVar1,"S",1);
            }
            else {
              std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
              bVar11 = false;
            }
            uVar9 = (ulong)uVar10;
          } while (uVar9 < this->_m_nrStateFeatures);
        }
        std::__cxx11::stringbuf::str();
        MADPComponentDiscreteStates::AddState(local_1c8,&local_270);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_270._M_dataplus._M_p != &local_270.field_2) {
          operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
        }
        dVar12 = local_1d0;
        if (bVar11) {
          if ((ulong)((long)local_1f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)local_1f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start >> 3) <= (ulong)local_238) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
          }
          local_1f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[(long)local_238] = local_1d8;
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
        std::ios_base::~ios_base(local_138);
        if (local_210.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_210.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_210.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_210.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        dVar21 = (double)(ulong)(SUB84(local_238,0) + 1);
      } while ((ulong)dVar21 < (ulong)dVar12);
    }
    p = (StateDistribution *)operator_new(0x20);
    p->_vptr_StateDistribution = (_func_int **)&PTR__StateDistribution_0059cc60;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)(p + 1),&local_1f8);
    p->_vptr_StateDistribution = (_func_int **)&PTR__StateDistributionVector_0059cb98;
    MADPComponentDiscreteStates::SetISD
              (&(this->super_DecPOMDPDiscrete).super_MultiAgentDecisionProcessDiscrete._m_S,p);
    if (local_1f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_230._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_230._M_dataplus._M_p,
                      local_230.field_2._M_allocated_capacity - (long)local_230._M_dataplus._M_p);
    }
  }
  MADPComponentDiscreteStates::SetInitialized
            (&(this->super_DecPOMDPDiscrete).super_MultiAgentDecisionProcessDiscrete._m_S,true);
  (**(code **)(*(long *)&(this->super_DecPOMDPDiscrete).super_MultiAgentDecisionProcessDiscrete.
                         field_0x200 + 0x68))(0x3ff0000000000000);
  ConstructActions(this);
  this_00 = &(this->super_DecPOMDPDiscrete).super_MultiAgentDecisionProcessDiscrete._m_A;
  MADPComponentDiscreteActions::ConstructJointActions(this_00);
  MADPComponentDiscreteActions::SetInitialized(this_00,true);
  ConstructObservations(this);
  this_01 = &(this->super_DecPOMDPDiscrete).super_MultiAgentDecisionProcessDiscrete._m_O;
  MADPComponentDiscreteObservations::ConstructJointObservations(this_01);
  MADPComponentDiscreteObservations::SetInitialized(this_01,true);
  MultiAgentDecisionProcessDiscrete::CreateNewTransitionModel
            ((MultiAgentDecisionProcessDiscrete *)this);
  FillTransitionModel(this);
  MultiAgentDecisionProcessDiscrete::CreateNewObservationModel
            ((MultiAgentDecisionProcessDiscrete *)this);
  FillObservationModel(this);
  MultiAgentDecisionProcessDiscrete::SetInitialized((MultiAgentDecisionProcessDiscrete *)this,true);
  (**(code **)(*(long *)&(this->super_DecPOMDPDiscrete).super_MultiAgentDecisionProcessDiscrete.
                         super_MultiAgentDecisionProcess + 0x178))(this);
  FillRewardModel(this);
  DecPOMDPDiscrete::SetInitialized(&this->super_DecPOMDPDiscrete,true);
  return;
}

Assistant:

ProblemFireFighting::ProblemFireFighting(
        size_t nrAgents, size_t nrHouses, size_t nrFLs,
        double costOfMove, bool forcePositionRepres)
    :
        DecPOMDPDiscrete(
                SoftPrintBriefDescription(nrAgents, nrHouses, nrFLs),
                SoftPrintDescription(nrAgents, nrHouses, nrFLs),
                SoftPrintBriefDescription(nrAgents, nrHouses, nrFLs)
                )
        ,_m_nrAgents(nrAgents)
        ,_m_nrHouses(nrHouses)
        ,_m_nrFireLevels(nrFLs)
{
    SetSparse(true);
    SetNrAgents(nrAgents);


    double S = pow((double)nrFLs, (double)nrHouses);
    _m_nrJointFirelevels = (size_t) S;
    _m_nrFLs_vec =  vector<size_t>(nrHouses, nrFLs);

    //Create states, and ISD
    if(costOfMove > 0.0 || forcePositionRepres)
    {
        cout << "Including position"<<endl;
        _m_includePositions = true;
        //we're duplicating the generation of states as the matlab code does
        //(this is not the best thing as it generates states where one agent 
        //is in a start state and the other is not...)


        //the s_vec has the form <fl...fl_h, pos...pos_n>
        _m_nrStateFeatures = nrHouses+nrAgents;
        size_t nrPos = nrHouses+1; //include the 'start' position.

        _m_nrFLs_vec = vector<size_t>(nrHouses, nrFLs);
        vector< size_t > nrPos_vec = vector<size_t>(nrAgents, nrPos);
        _m_nrPerStateFeatureVec =  _m_nrFLs_vec;
        _m_nrPerStateFeatureVec.insert(
                _m_nrPerStateFeatureVec.end(), //insert position
                nrPos_vec.begin(),  //the stuff that is 
                nrPos_vec.end()     //appended...
                );
        if(DEBUG_PFF)
            cout << "_m_nrPerStateFeatureVec=" <<
                SoftPrintVector(_m_nrPerStateFeatureVec) << endl;
        size_t nrS=1;
        for(vector<size_t>::const_iterator it = _m_nrPerStateFeatureVec.begin();
                it < _m_nrPerStateFeatureVec.end();
                it++)
            nrS *= *it;

        vector<double> isd(nrS, 0.0);
        double nrStartStates = pow((double)nrFLs, (double)nrHouses);
        double ssprob = 1.0 / nrStartStates;

        for(Index sI = 0; sI < nrS; sI++)
        {
            vector< Index> s_vec = GetStateVector(sI);
            stringstream ss;
            ss << "S_";
            Index t1;
            for(t1 = 0; t1 < nrHouses; t1++)
                ss << "f" << s_vec.at(t1);
            bool isStartState = true;
            for(; t1 < _m_nrStateFeatures; t1++)
            {
                Index hI =  s_vec.at(t1);
                ss << "h";
                if(hI == nrHouses) //start position
                    ss << "S";
                else
                {
                    ss << hI;
                    isStartState = false;
                }
            }
            this->AddState(ss.str());
            if(isStartState)
                isd.at(sI) = ssprob;

            if(DEBUG_PFF)
            {
                cout << "added " << this->GetState(sI)->SoftPrintBrief()<<endl;
            }
        }
        StateDistributionVector *isdv=new StateDistributionVector(isd);
        this->SetISD(isdv);

    }
    else
    {
        cout << "Not including positions" << endl;
        _m_includePositions = false;
        //the s_vec has the form <fl...fl_h>
        _m_nrStateFeatures = nrHouses;        
        _m_nrPerStateFeatureVec = _m_nrFLs_vec;

        if(DEBUG_PFF)
            cout << "_m_nrPerStateFeatureVec=" <<
                SoftPrintVector(_m_nrPerStateFeatureVec) << endl;

        size_t nrS = _m_nrJointFirelevels;
        if(DEBUG_PFF)
            cout << "nrStates="<<nrS<<endl;
        for(Index sI = 0; sI < nrS; sI++)
        {
            vector< Index> s_vec = GetStateVector(sI);
            stringstream ss;
            ss << "S_" << SoftPrintVector(s_vec);
            this->AddState(ss.str());
            if(DEBUG_PFF)
            {
                cout << "added " << this->GetState(sI)->SoftPrintBrief()<<endl;
            }
        }
        SetUniformISD();
    }

    SetStatesInitialized(true);
    SetDiscount(1);
    
    // add actions:
    ConstructActions();
    if(DEBUG_CJA) cout << ">>>Creating joint actions and set..."<<endl;
    // add joint actions
    size_t testNRJA = ConstructJointActions();
    if(DEBUG_CA) cout << "testNRJA="<<testNRJA<<endl;    

    SetActionsInitialized(true);

    // add observations:
    ConstructObservations();
    size_t testNRJO = ConstructJointObservations();
    if(DEBUG_CO) cout << "testNRJO="<<testNRJO<<endl;

    SetObservationsInitialized(true);

    // add the transition model
    if(DEBUG_PFF) cout << ">>>Adding Transition model..."<<endl;
    CreateNewTransitionModel();
    FillTransitionModel();    

    // add observation model
    if(DEBUG_PFF) cout << ">>>Adding Observation model..."<<endl;
    CreateNewObservationModel();
    FillObservationModel();
    MultiAgentDecisionProcessDiscrete::SetInitialized(true);

    // add rewards
    CreateNewRewardModel();
    FillRewardModel();
    if(DEBUG_PFF)     cout << "Model created..."<<endl; 
    DecPOMDPDiscrete::SetInitialized(true);
}